

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uchar * SOIL_load_image_from_memory
                  (uchar *buffer,int buffer_length,int *width,int *height,int *channels,
                  int force_channels)

{
  stbi_uc *psVar1;
  undefined8 in_RCX;
  int *in_RDX;
  undefined4 in_ESI;
  int *in_RDI;
  uchar *result;
  undefined4 in_stack_00000008;
  undefined4 in_stack_fffffffffffffff0;
  
  psVar1 = stbi_load_from_memory
                     ((stbi_uc *)CONCAT44(force_channels,in_stack_00000008),result._4_4_,in_RDI,
                      (int *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                      (int)((ulong)in_RCX >> 0x20));
  if (psVar1 == (stbi_uc *)0x0) {
    result_string_pointer = stbi_failure_reason();
  }
  else {
    result_string_pointer = "Image loaded from memory";
  }
  return psVar1;
}

Assistant:

unsigned char*
	SOIL_load_image_from_memory
	(
		const unsigned char *const buffer,
		int buffer_length,
		int *width, int *height, int *channels,
		int force_channels
	)
{
	unsigned char *result = stbi_load_from_memory(
				buffer, buffer_length,
				width, height, channels,
				force_channels );
	if( result == NULL )
	{
		result_string_pointer = stbi_failure_reason();
	} else
	{
		result_string_pointer = "Image loaded from memory";
	}
	return result;
}